

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsLineItem::setLine(QGraphicsLineItem *this,QLineF *line)

{
  long lVar1;
  bool bVar2;
  QGraphicsLineItemPrivate *lhs;
  qreal *in_RSI;
  QLineF *in_RDI;
  long in_FS_OFFSET;
  QGraphicsLineItemPrivate *d;
  QRectF *in_stack_ffffffffffffffd8;
  QGraphicsItem *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = d_func((QGraphicsLineItem *)0x98a1ee);
  bVar2 = ::operator==((QLineF *)lhs,in_RDI);
  if (!bVar2) {
    QGraphicsItem::prepareGeometryChange((QGraphicsItem *)d);
    (lhs->line).pt1.xp = *in_RSI;
    (lhs->line).pt1.yp = in_RSI[1];
    (lhs->line).pt2.xp = in_RSI[2];
    (lhs->line).pt2.yp = in_RSI[3];
    QRectF::QRectF((QRectF *)&stack0xffffffffffffffd8);
    QGraphicsItem::update(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsLineItem::setLine(const QLineF &line)
{
    Q_D(QGraphicsLineItem);
    if (d->line == line)
        return;
    prepareGeometryChange();
    d->line = line;
    update();
}